

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar1;
  undefined4 in_stack_ffffffffffffffd0;
  
  JVar1.tag = in_RSI;
  JVar1.u.float64 = in_RDI.float64;
  JVar1 = js_thisStringValue((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),JVar1);
  return JVar1;
}

Assistant:

static JSValue js_string_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    return js_thisStringValue(ctx, this_val);
}